

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

int __thiscall Fl_X::set_cursor(Fl_X *this,Fl_Cursor c)

{
  int iVar1;
  Cursor CVar2;
  undefined8 uVar3;
  Cursor *pCVar4;
  
  iVar1 = 0;
  if ((int)c < 0x2f) {
    if ((int)c < 0x1b) {
      if (c == FL_CURSOR_SW) {
        CVar2 = set_cursor::xc_sw;
        if (set_cursor::xc_sw == 0) {
          pCVar4 = &set_cursor::xc_sw;
          uVar3 = 0xc;
          goto LAB_001907d2;
        }
      }
      else if (c == FL_CURSOR_SE) {
        CVar2 = set_cursor::xc_se;
        if (set_cursor::xc_se == 0) {
          pCVar4 = &set_cursor::xc_se;
          uVar3 = 0xe;
          goto LAB_001907d2;
        }
      }
      else {
        if (c != FL_CURSOR_S) {
          return 0;
        }
        CVar2 = set_cursor::xc_s;
        if (set_cursor::xc_s == 0) {
          pCVar4 = &set_cursor::xc_s;
          uVar3 = 0x10;
          goto LAB_001907d2;
        }
      }
    }
    else {
      switch(c) {
      case FL_CURSOR_MOVE:
        CVar2 = set_cursor::xc_move;
        if (set_cursor::xc_move == 0) {
          pCVar4 = &set_cursor::xc_move;
          uVar3 = 0x34;
          goto LAB_001907d2;
        }
        break;
      default:
        goto switchD_00190572_caseD_43;
      case FL_CURSOR_HAND:
        CVar2 = set_cursor::xc_hand;
        if (set_cursor::xc_hand == 0) {
          pCVar4 = &set_cursor::xc_hand;
          uVar3 = 0x3c;
          goto LAB_001907d2;
        }
        break;
      case FL_CURSOR_ARROW:
        CVar2 = set_cursor::xc_arrow;
        if (set_cursor::xc_arrow == 0) {
          pCVar4 = &set_cursor::xc_arrow;
          uVar3 = 0x44;
          goto LAB_001907d2;
        }
        break;
      case FL_CURSOR_W:
        CVar2 = set_cursor::xc_w;
        if (set_cursor::xc_w == 0) {
          pCVar4 = &set_cursor::xc_w;
          uVar3 = 0x46;
          goto LAB_001907d2;
        }
      }
    }
  }
  else {
    iVar1 = 0;
    switch(c) {
    case FL_CURSOR_CROSS:
      CVar2 = set_cursor::xc_cross;
      if (set_cursor::xc_cross == 0) {
        pCVar4 = &set_cursor::xc_cross;
        uVar3 = 0x82;
LAB_001907d2:
        CVar2 = XCreateFontCursor(fl_display,uVar3);
        *pCVar4 = CVar2;
      }
      break;
    case 0x43:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
      goto switchD_00190572_caseD_43;
    case FL_CURSOR_NW:
      CVar2 = set_cursor::xc_nw;
      if (set_cursor::xc_nw == 0) {
        pCVar4 = &set_cursor::xc_nw;
        uVar3 = 0x86;
        goto LAB_001907d2;
      }
      break;
    case FL_CURSOR_NE:
      CVar2 = set_cursor::xc_ne;
      if (set_cursor::xc_ne == 0) {
        pCVar4 = &set_cursor::xc_ne;
        uVar3 = 0x88;
        goto LAB_001907d2;
      }
      break;
    case FL_CURSOR_N:
      CVar2 = set_cursor::xc_n;
      if (set_cursor::xc_n == 0) {
        pCVar4 = &set_cursor::xc_n;
        uVar3 = 0x8a;
        goto LAB_001907d2;
      }
      break;
    case FL_CURSOR_WAIT:
      CVar2 = set_cursor::xc_wait;
      if (set_cursor::xc_wait == 0) {
        pCVar4 = &set_cursor::xc_wait;
        uVar3 = 0x96;
        goto LAB_001907d2;
      }
      break;
    case FL_CURSOR_INSERT:
      CVar2 = set_cursor::xc_insert;
      if (set_cursor::xc_insert == 0) {
        pCVar4 = &set_cursor::xc_insert;
        uVar3 = 0x98;
        goto LAB_001907d2;
      }
      break;
    case FL_CURSOR_NS:
      CVar2 = set_cursor::xc_ns;
      if (set_cursor::xc_ns == 0) {
        pCVar4 = &set_cursor::xc_ns;
        uVar3 = 0x74;
        goto LAB_001907d2;
      }
      break;
    case FL_CURSOR_WE:
      CVar2 = set_cursor::xc_we;
      if (set_cursor::xc_we == 0) {
        pCVar4 = &set_cursor::xc_we;
        uVar3 = 0x6c;
        goto LAB_001907d2;
      }
      break;
    default:
      if (c == FL_CURSOR_HELP) {
        CVar2 = set_cursor::xc_help;
        if (set_cursor::xc_help == 0) {
          pCVar4 = &set_cursor::xc_help;
          uVar3 = 0x5c;
          goto LAB_001907d2;
        }
      }
      else {
        if (c != FL_CURSOR_E) {
          return 0;
        }
        CVar2 = set_cursor::xc_e;
        if (set_cursor::xc_e == 0) {
          pCVar4 = &set_cursor::xc_e;
          uVar3 = 0x60;
          goto LAB_001907d2;
        }
      }
    }
  }
  XDefineCursor(fl_display,this->xid,CVar2);
  iVar1 = 1;
switchD_00190572_caseD_43:
  return iVar1;
}

Assistant:

int Fl_X::set_cursor(Fl_Cursor c) {

  /* The cursors are cached, because creating one takes 0.5ms including
     opening, reading, and closing theme files. They are kept until program
     exit by design, which valgrind will note as reachable. */
  static Cursor xc_arrow = None;
  static Cursor xc_cross = None;
  static Cursor xc_wait = None;
  static Cursor xc_insert = None;
  static Cursor xc_hand = None;
  static Cursor xc_help = None;
  static Cursor xc_move = None;
  static Cursor xc_ns = None;
  static Cursor xc_we = None;
  static Cursor xc_ne = None;
  static Cursor xc_n = None;
  static Cursor xc_nw = None;
  static Cursor xc_e = None;
  static Cursor xc_w = None;
  static Cursor xc_se = None;
  static Cursor xc_s = None;
  static Cursor xc_sw = None;

  Cursor xc;

#define cache_cursor(name, var) if (var == None) { \
                                  var = XCreateFontCursor(fl_display, name); \
                                } \
                                xc = var

  switch (c) {
  case FL_CURSOR_ARROW:   cache_cursor(XC_left_ptr, xc_arrow); break;
  case FL_CURSOR_CROSS:   cache_cursor(XC_tcross, xc_cross); break;
  case FL_CURSOR_WAIT:    cache_cursor(XC_watch, xc_wait); break;
  case FL_CURSOR_INSERT:  cache_cursor(XC_xterm, xc_insert); break;
  case FL_CURSOR_HAND:    cache_cursor(XC_hand2, xc_hand); break;
  case FL_CURSOR_HELP:    cache_cursor(XC_question_arrow, xc_help); break;
  case FL_CURSOR_MOVE:    cache_cursor(XC_fleur, xc_move); break;
  case FL_CURSOR_NS:      cache_cursor(XC_sb_v_double_arrow, xc_ns); break;
  case FL_CURSOR_WE:      cache_cursor(XC_sb_h_double_arrow, xc_we); break;
  case FL_CURSOR_NE:      cache_cursor(XC_top_right_corner, xc_ne); break;
  case FL_CURSOR_N:       cache_cursor(XC_top_side, xc_n); break;
  case FL_CURSOR_NW:      cache_cursor(XC_top_left_corner, xc_nw); break;
  case FL_CURSOR_E:       cache_cursor(XC_right_side, xc_e); break;
  case FL_CURSOR_W:       cache_cursor(XC_left_side, xc_w); break;
  case FL_CURSOR_SE:      cache_cursor(XC_bottom_right_corner, xc_se); break;
  case FL_CURSOR_S:       cache_cursor(XC_bottom_side, xc_s); break;
  case FL_CURSOR_SW:      cache_cursor(XC_bottom_left_corner, xc_sw); break;
  default:
    return 0;
  }

#undef cache_cursor

  XDefineCursor(fl_display, xid, xc);

  return 1;
}